

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemMap.cpp
# Opt level: O0

void __thiscall MemMap::MemMap(MemMap *this,string *fname)

{
  int iVar1;
  char *__file;
  undefined8 uVar2;
  __off_t _Var3;
  void *pvVar4;
  string *__arg;
  string *in_RSI;
  allocator<char> *in_RDI;
  string *this_00;
  off_t fsize_tmp;
  string *in_stack_ffffffffffffff18;
  file_open_error *in_stack_ffffffffffffff20;
  file_open_error *this_01;
  undefined2 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 uVar5;
  runtime_error in_stack_ffffffffffffff67;
  
  this_00 = (string *)(in_RDI + 8);
  std::__cxx11::string::string(this_00,in_RSI);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = open(__file,0,0x180);
  *(int *)in_RDI = iVar1;
  if (*(int *)in_RDI == -1) {
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,CONCAT24(in_stack_ffffffffffffff64,iVar1)
                                )),(char *)this_00,in_RDI);
    file_open_error::file_open_error(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    __cxa_throw(uVar2,&file_open_error::typeinfo,file_open_error::~file_open_error);
  }
  _Var3 = lseek(*(int *)in_RDI,0,2);
  if (_Var3 == 0) {
    close(*(int *)in_RDI);
    uVar2 = __cxa_allocate_exception(0x30);
    empty_file_error::empty_file_error
              ((empty_file_error *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    __cxa_throw(uVar2,&empty_file_error::typeinfo,empty_file_error::~empty_file_error);
  }
  if (_Var3 == -1) {
    close(*(int *)in_RDI);
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,CONCAT24(in_stack_ffffffffffffff64,iVar1)
                                )),(char *)this_00,in_RDI);
    file_open_error::file_open_error(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    __cxa_throw(uVar2,&file_open_error::typeinfo,file_open_error::~file_open_error);
  }
  *(__off_t *)(in_RDI + 0x30) = _Var3;
  pvVar4 = mmap((void *)0x0,*(size_t *)(in_RDI + 0x30),1,1,*(int *)in_RDI,0);
  *(void **)(in_RDI + 0x28) = pvVar4;
  if (*(long *)(in_RDI + 0x28) == -1) {
    close(*(int *)in_RDI);
    uVar5 = 1;
    __arg = (string *)__cxa_allocate_exception(0x30);
    this_01 = (file_open_error *)&stack0xffffffffffffff67;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff64,iVar1))),(char *)this_00,
               in_RDI);
    file_open_error::file_open_error(this_01,__arg);
    __cxa_throw(__arg,&file_open_error::typeinfo,file_open_error::~file_open_error);
  }
  return;
}

Assistant:

MemMap::MemMap(const std::string &fname) : fname(fname) {
    fd = open(fname.c_str(), O_RDONLY, static_cast<mode_t>(0600));

    if (fd == -1) {
        throw file_open_error("file open error");
    }

    off_t fsize_tmp = lseek(fd, 0, SEEK_END);

    if (fsize_tmp == 0) {
        close(fd);
        throw empty_file_error(fname);
    }

    if (fsize_tmp == -1) {
        close(fd);
        throw file_open_error("lseek failed");
    }

    fsize = static_cast<uint64_t>(fsize_tmp);
    mmap_ptr = static_cast<uint8_t *>(
        mmap(nullptr, fsize, PROT_READ, MAP_SHARED, fd, 0));

    if (mmap_ptr == MAP_FAILED) {
        close(fd);
        throw file_open_error("mmap failed");
    }
}